

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

char * parse_id(char *p,char **save)

{
  char cVar1;
  ushort uVar2;
  ushort *puVar3;
  ushort **ppuVar4;
  union_tag *puVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  
  ppuVar4 = __ctype_b_loc();
  puVar3 = *ppuVar4;
  cVar1 = *p;
  lVar6 = (long)cVar1;
  uVar2 = puVar3[lVar6];
  iVar7 = rescan_lineno;
  while ((uVar2 >> 0xd & 1) != 0) {
    if ((char)lVar6 == '\n') {
      iVar7 = iVar7 + 1;
      rescan_lineno = iVar7;
    }
    p = p + 1;
    cVar1 = *p;
    lVar6 = (long)cVar1;
    uVar2 = puVar3[lVar6];
  }
  if ((cVar1 == '_') || ((uVar2 & 0x400) != 0)) {
    for (lVar6 = 0;
        ((cVar1 = p[lVar6], (puVar3[cVar1] & 8) != 0 || (cVar1 == '_')) || (cVar1 == '$'));
        lVar6 = lVar6 + 1) {
    }
    pcVar8 = p + lVar6;
    if (save != (char **)0x0) {
      puVar5 = cache_tag(p,(int)lVar6);
      *save = puVar5->name;
    }
  }
  else {
    pcVar8 = (char *)0x0;
  }
  return pcVar8;
}

Assistant:

static char *parse_id(char *p, char **save)
{
char	*b;

    while (isspace(*p)) if (*p++ == '\n') rescan_lineno++;
    if (!isalpha(*p) && *p != '_') return 0;
    b = p;
    while (isalnum(*p) || *p == '_' || *p == '$') p++;
    if (save) {
	*save = cache_tag(b, p-b)->name; }
    return p;
}